

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatmain.c
# Opt level: O1

uint64 ecx_readeepromFP(ecx_contextt *context,uint16 configadr,uint16 eeproma,int timeout)

{
  uint16 uVar1;
  int iVar2;
  undefined6 in_register_00000012;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  uint16 estat;
  uint32 edat32;
  ec_eepromt ed;
  uint64 edat64;
  uint16 local_4e;
  uint local_4c;
  undefined2 local_46;
  undefined2 local_44;
  undefined2 local_42;
  ulong local_40;
  int local_38;
  undefined4 local_34;
  
  local_34 = (undefined4)CONCAT62(in_register_00000012,eeproma);
  local_40 = 0;
  local_4c = 0;
  local_38 = timeout;
  uVar1 = ecx_eeprom_waitnotbusyFP(context,configadr,&local_4e,timeout);
  if (uVar1 != 0) {
    if ((local_4e & 0x7800) != 0) {
      local_4e = 0;
      ecx_FPWR(context->port,configadr,0x502,2,&local_4e,6000);
    }
    uVar3 = 0;
    do {
      local_46 = 0x100;
      local_44 = (undefined2)local_34;
      local_42 = 0;
      uVar4 = 0;
      do {
        iVar2 = ecx_FPWR(context->port,configadr,0x502,6,&local_46,2000);
        if (0 < iVar2) break;
        bVar5 = uVar4 < 3;
        uVar4 = uVar4 + 1;
      } while (bVar5);
      if (iVar2 != 0) {
        osal_usleep(200);
        local_4e = 0;
        uVar1 = ecx_eeprom_waitnotbusyFP(context,configadr,&local_4e,local_38);
        if (uVar1 != 0) {
          if ((local_4e >> 0xd & 1) == 0) {
            uVar3 = 0;
            if ((local_4e & 0x40) == 0) {
              do {
                iVar2 = ecx_FPRD(context->port,configadr,0x508,4,&local_4c,2000);
                if (0 < iVar2) break;
                bVar5 = uVar3 < 3;
                uVar3 = uVar3 + 1;
              } while (bVar5);
              local_40 = (ulong)local_4c;
              uVar3 = 0;
            }
            else {
              uVar4 = 0;
              do {
                iVar2 = ecx_FPRD(context->port,configadr,0x508,8,&local_40,2000);
                uVar3 = 0;
                if (0 < iVar2) break;
                bVar5 = uVar4 < 3;
                uVar3 = 0;
                uVar4 = uVar4 + 1;
              } while (bVar5);
            }
          }
          else {
            osal_usleep(1000);
            uVar3 = uVar3 + 1;
          }
        }
      }
    } while (uVar3 - 1 < 2);
  }
  return local_40;
}

Assistant:

uint64 ecx_readeepromFP(ecx_contextt *context, uint16 configadr, uint16 eeproma, int timeout)
{
   uint16 estat;
   uint32 edat32;
   uint64 edat64;
   ec_eepromt ed;
   int wkc, cnt, nackcnt = 0;

   edat64 = 0;
   edat32 = 0;
   if (ecx_eeprom_waitnotbusyFP(context, configadr, &estat, timeout))
   {
      if (estat & EC_ESTAT_EMASK) /* error bits are set */
      {
         estat = htoes(EC_ECMD_NOP); /* clear error bits */
         wkc=ecx_FPWR(context->port, configadr, ECT_REG_EEPCTL, sizeof(estat), &estat, EC_TIMEOUTRET3);
      }

      do
      {
         ed.comm = htoes(EC_ECMD_READ);
         ed.addr = htoes(eeproma);
         ed.d2   = 0x0000;
         cnt = 0;
         do
         {
            wkc=ecx_FPWR(context->port, configadr, ECT_REG_EEPCTL, sizeof(ed), &ed, EC_TIMEOUTRET);
         }
         while ((wkc <= 0) && (cnt++ < EC_DEFAULTRETRIES));
         if (wkc)
         {
            osal_usleep(EC_LOCALDELAY);
            estat = 0x0000;
            if (ecx_eeprom_waitnotbusyFP(context, configadr, &estat, timeout))
            {
               if (estat & EC_ESTAT_NACK)
               {
                  nackcnt++;
                  osal_usleep(EC_LOCALDELAY * 5);
               }
               else
               {
                  nackcnt = 0;
                  if (estat & EC_ESTAT_R64)
                  {
                     cnt = 0;
                     do
                     {
                        wkc=ecx_FPRD(context->port, configadr, ECT_REG_EEPDAT, sizeof(edat64), &edat64, EC_TIMEOUTRET);
                     }
                     while ((wkc <= 0) && (cnt++ < EC_DEFAULTRETRIES));
                  }
                  else
                  {
                     cnt = 0;
                     do
                     {
                        wkc=ecx_FPRD(context->port, configadr, ECT_REG_EEPDAT, sizeof(edat32), &edat32, EC_TIMEOUTRET);
                     }
                     while ((wkc <= 0) && (cnt++ < EC_DEFAULTRETRIES));
                     edat64=(uint64)edat32;
                  }
               }
            }
         }
      }
      while ((nackcnt > 0) && (nackcnt < 3));
   }

   return edat64;
}